

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O3

void __thiscall SQClass::Finalize(SQClass *this)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  SQObjectType SVar3;
  uint uVar4;
  SQTable *pSVar5;
  long *plVar6;
  SQClass *pSVar7;
  long lVar8;
  long lVar9;
  SQClassMember local_38;
  
  pSVar5 = (this->_attributes).super_SQObject._unVal.pTable;
  SVar3 = (this->_attributes).super_SQObject._type;
  (this->_attributes).super_SQObject._type = OT_NULL;
  (this->_attributes).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar2 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 - 1;
    if (*pSVar2 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  if (0 < (long)(this->_defaultvalues)._size) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      SQClassMember::Null((SQClassMember *)
                          ((long)&(((this->_defaultvalues)._vals)->val).super_SQObject._type + lVar8
                          ));
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (lVar9 < (long)(this->_defaultvalues)._size);
  }
  local_38.val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.val.super_SQObject._type = OT_NULL;
  local_38.val.super_SQObject._4_4_ = 0;
  local_38.attrs.super_SQObject._type = OT_NULL;
  local_38.attrs.super_SQObject._4_4_ = 0;
  sqvector<SQClassMember>::resize(&this->_methods,0,&local_38);
  SQObjectPtr::~SQObjectPtr(&local_38.attrs);
  SQObjectPtr::~SQObjectPtr(&local_38.val);
  lVar8 = 0x78;
  do {
    plVar6 = *(long **)((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).
                               super_SQRefCounted._vptr_SQRefCounted + lVar8);
    uVar4 = *(uint *)((long)this->_metamethods + lVar8 + -0x78);
    *(undefined4 *)((long)this->_metamethods + lVar8 + -0x78) = 0x1000001;
    *(undefined8 *)
     ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).super_SQRefCounted.
             _vptr_SQRefCounted + lVar8) = 0;
    if ((uVar4 >> 0x1b & 1) != 0) {
      plVar1 = plVar6 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*plVar6 + 0x10))();
      }
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x198);
  pSVar5 = this->_members;
  if (pSVar5 != (SQTable *)0x0) {
    pSVar2 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 - 1;
    if (*pSVar2 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_members = (SQTable *)0x0;
  }
  pSVar7 = this->_base;
  if (pSVar7 != (SQClass *)0x0) {
    pSVar2 = &(pSVar7->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 - 1;
    if (*pSVar2 == 0) {
      (*(pSVar7->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_base = (SQClass *)0x0;
  }
  return;
}

Assistant:

void SQClass::Finalize() {
    _attributes.Null();
    _NULL_SQOBJECT_VECTOR(_defaultvalues,_defaultvalues.size());
    _methods.resize(0);
    _NULL_SQOBJECT_VECTOR(_metamethods,MT_LAST);
    __ObjRelease(_members);
    if(_base) {
        __ObjRelease(_base);
    }
}